

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

SurfaceInteraction * __thiscall
pbrt::Disk::InteractionFromIntersection
          (Disk *this,QuadricIntersection *isect,Vector3f *wo,Float time)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  long in_RDX;
  long in_RSI;
  SurfaceInteraction *in_RDI;
  double dVar3;
  undefined1 auVar7 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  Vector3<float> VVar8;
  SurfaceInteraction *in_stack_00000020;
  Transform *in_stack_00000028;
  Vector3f woObject;
  bool flipNormal;
  Vector3f pError;
  Normal3f dndv;
  Normal3f dndu;
  Vector3f dpdv;
  Vector3f dpdu;
  Float v;
  Float rHit;
  Float u;
  Float phi;
  Point3f pHit;
  undefined8 in_stack_fffffffffffffdb8;
  Normal3<float> *in_stack_fffffffffffffdc0;
  float in_stack_fffffffffffffdcc;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffdd0;
  Point3f *p;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 uVar9;
  undefined1 in_stack_fffffffffffffe13;
  Float in_stack_fffffffffffffe14;
  Vector3f *in_stack_fffffffffffffe18;
  Vector3f *in_stack_fffffffffffffe20;
  Vector3f *in_stack_fffffffffffffe28;
  Point2f *in_stack_fffffffffffffe30;
  Point3fi *in_stack_fffffffffffffe38;
  SurfaceInteraction *in_stack_fffffffffffffe40;
  Normal3f *in_stack_fffffffffffffe50;
  Normal3f *in_stack_fffffffffffffe58;
  Vector3<float> *in_stack_fffffffffffffec8;
  Transform *in_stack_fffffffffffffed0;
  Point3f local_74;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  undefined8 local_30;
  undefined4 local_28;
  
  local_28 = *(undefined4 *)(in_RDX + 0xc);
  uVar1 = *(undefined8 *)(in_RDX + 4);
  local_34 = *(float *)(in_RDX + 0x10);
  local_38 = local_34 / *(float *)(in_RSI + 0x20);
  local_30._0_4_ = (uint)uVar1;
  local_30._4_4_ = (float)((ulong)uVar1 >> 0x20);
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_30),ZEXT416((uint)local_30),
                           ZEXT416((uint)(local_30._4_4_ * local_30._4_4_)));
  local_30 = uVar1;
  dVar3 = std::sqrt(auVar2._0_8_);
  local_3c = SUB84(dVar3,0);
  local_40 = (*(float *)(in_RSI + 0x18) - local_3c) /
             (*(float *)(in_RSI + 0x18) - *(float *)(in_RSI + 0x1c));
  uVar9 = 0;
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffffdc0,
             (float)((ulong)in_stack_fffffffffffffdb8 >> 0x20),(float)in_stack_fffffffffffffdb8,0.0)
  ;
  p = &local_74;
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffffdc0,
             (float)((ulong)in_stack_fffffffffffffdb8 >> 0x20),(float)in_stack_fffffffffffffdb8,0.0)
  ;
  auVar7 = (undefined1  [56])0x0;
  VVar8 = Tuple3<pbrt::Vector3,float>::operator*
                    (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
  local_60 = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar7;
  local_68 = vmovlpd_avx(auVar4._0_16_);
  auVar7 = (undefined1  [56])0x0;
  VVar8 = Tuple3<pbrt::Vector3,float>::operator/
                    (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
  local_50 = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar7;
  local_58 = vmovlpd_avx(auVar5._0_16_);
  Normal3<float>::Normal3
            (in_stack_fffffffffffffdc0,(float)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
             (float)in_stack_fffffffffffffdb8,0.0);
  Normal3<float>::Normal3
            (in_stack_fffffffffffffdc0,(float)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
             (float)in_stack_fffffffffffffdb8,0.0);
  local_28 = *(undefined4 *)(in_RSI + 0x14);
  auVar7 = ZEXT856(0);
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffffdc0,
             (float)((ulong)in_stack_fffffffffffffdb8 >> 0x20),(float)in_stack_fffffffffffffdb8,0.0)
  ;
  VVar8 = Transform::operator()(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  auVar6._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar7;
  vmovlpd_avx(auVar6._0_16_);
  Point3fi::Point3fi((Point3fi *)CONCAT44(uVar9,in_stack_fffffffffffffde0),p,
                     (Vector3f *)in_stack_fffffffffffffdd0);
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffdc0,
             (float)((ulong)in_stack_fffffffffffffdb8 >> 0x20),(float)in_stack_fffffffffffffdb8);
  SurfaceInteraction::SurfaceInteraction
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe14,
             (bool)in_stack_fffffffffffffe13);
  Transform::operator()(in_stack_00000028,in_stack_00000020);
  return in_RDI;
}

Assistant:

InteractionFromIntersection(const QuadricIntersection &isect,
                                                   const Vector3f &wo, Float time) const {
        Point3f pHit = isect.pObj;
        Float phi = isect.phi;
        // Find parametric representation of disk hit
        Float u = phi / phiMax;
        Float rHit = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
        Float v = (radius - rHit) / (radius - innerRadius);
        Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
        Vector3f dpdv = Vector3f(pHit.x, pHit.y, 0.) * (innerRadius - radius) / rHit;
        Normal3f dndu(0, 0, 0), dndv(0, 0, 0);

        // Refine disk intersection point
        pHit.z = height;

        // Compute error bounds for disk intersection
        Vector3f pError(0, 0, 0);

        // Return _SurfaceInteraction_ for quadric intersection
        bool flipNormal = reverseOrientation ^ transformSwapsHandedness;
        Vector3f woObject = (*objectFromRender)(wo);
        return (*renderFromObject)(SurfaceInteraction(Point3fi(pHit, pError),
                                                      Point2f(u, v), woObject, dpdu, dpdv,
                                                      dndu, dndv, time, flipNormal));
    }